

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O0

void __thiscall Nes_Vrc6::write_osc(Nes_Vrc6 *this,cpu_time_t time,int osc_index,int reg,int data)

{
  uint in_ECX;
  uint in_EDX;
  cpu_time_t in_RDI;
  undefined4 in_R8D;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (2 < in_EDX) {
    __assert_fail("( \"unmet requirement\", (unsigned) osc_index < osc_count )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Vrc6.cpp"
                  ,0x4b,"void Nes_Vrc6::write_osc(cpu_time_t, int, int, int)");
  }
  if (in_ECX < 3) {
    run_until((Nes_Vrc6 *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_RDI);
    *(char *)(in_RDI + (long)(int)in_EDX * 0x20 + (long)(int)in_ECX) = (char)in_R8D;
    return;
  }
  __assert_fail("( \"unmet requirement\", (unsigned) reg < reg_count )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Vrc6.cpp"
                ,0x4c,"void Nes_Vrc6::write_osc(cpu_time_t, int, int, int)");
}

Assistant:

void Nes_Vrc6::write_osc( cpu_time_t time, int osc_index, int reg, int data )
{
	require( (unsigned) osc_index < osc_count );
	require( (unsigned) reg < reg_count );
	
	run_until( time );
	oscs [osc_index].regs [reg] = data;
}